

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::Identifier> __thiscall
mocker::Parser::identifier(Parser *this,TokIter *iter,TokIter end)

{
  TokenID TVar1;
  pointer pTVar2;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Position beg;
  shared_ptr<mocker::ast::Identifier> sVar4;
  Position end_00;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_88;
  size_t local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  size_t local_70;
  size_t local_68;
  undefined1 local_60 [8];
  pair<mocker::Position,_mocker::Position> pos;
  GetTokenID local_30;
  Token *local_28;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_28 = end._M_current;
  iter_local = iter;
  end_local._M_current = (Token *)this;
  GetTokenID::GetTokenID(&local_30,in_RCX);
  pos.second.col = *(size_t *)local_28;
  TVar1 = GetTokenID::operator()(&local_30,(TokIter)pos.second.col);
  if (TVar1 == Identifier) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
             ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                           *)local_28);
    Token::position((pair<mocker::Position,_mocker::Position> *)local_60,pTVar2);
    local_70 = (size_t)local_60;
    local_68 = pos.first.line;
    local_80 = pos.first.col;
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pos.second.line;
    local_88 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator++(local_28,0);
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
             ::operator->(&local_88);
    Token::val<std::__cxx11::string>(pTVar2);
    beg.col = local_70;
    beg.line = (size_t)iter;
    end_00.col = local_80;
    end_00.line = local_68;
    sVar4 = makeNode<mocker::ast::Identifier,std::__cxx11::string_const&>(this,beg,end_00,local_78);
    _Var3 = sVar4.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<mocker::ast::Identifier>::shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Identifier>)
         sVar4.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Identifier> Parser::identifier(TokIter &iter,
                                                    TokIter end) {
  if (GetTokenID(end)(iter) != TokenID::Identifier)
    return nullptr;
  auto pos = iter->position();
  return makeNode<ast::Identifier>(pos.first, pos.second,
                                   (iter++)->val<std::string>());
}